

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time_impl.h
# Opt level: O0

mbedtls_ct_uint_t mbedtls_ct_compiler_opaque(mbedtls_ct_uint_t x)

{
  mbedtls_ct_uint_t x_local;
  
  return x;
}

Assistant:

static inline mbedtls_ct_uint_t mbedtls_ct_compiler_opaque(mbedtls_ct_uint_t x)
{
#if defined(MBEDTLS_CT_ASM)
    asm volatile ("" : [x] "+r" (x) :);
    return x;
#else
    return x ^ mbedtls_ct_zero;
#endif
}